

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_replace(REF_CAVITY ref_cavity)

{
  REF_GRID pRVar1;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  REF_LIST pRVar9;
  REF_ADJ pRVar10;
  int iVar11;
  long lVar12;
  REF_GRID pRVar13;
  undefined8 uVar14;
  REF_INT node;
  REF_CELL pRVar15;
  REF_CELL pRVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  REF_CELL *ppRVar20;
  REF_LIST ref_list;
  REF_INT new_cell;
  REF_INT nodes [27];
  REF_DBL volume;
  REF_INT local_cc;
  REF_CELL local_c8;
  REF_CELL local_c0;
  REF_LIST local_b8;
  REF_INT local_ac;
  uint local_a8 [28];
  double local_38;
  
  pRVar1 = ref_cavity->ref_grid;
  ref_node = pRVar1->node;
  ref_geom = pRVar1->geom;
  if ((ref_cavity->debug != 0) &&
     (uVar4 = ref_cavity_tec(ref_cavity,"ref_cavity_replace.tec"), uVar4 != 0)) {
    pcVar18 = "tec for replace fail";
    uVar14 = 0x280;
    goto LAB_0017eb5a;
  }
  uVar17 = (ulong)ref_cavity->state;
  if (uVar17 != 1) {
    pcVar18 = "attempt to replace cavity that is not visible";
    uVar14 = 0x283;
LAB_0017ebd3:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar14
           ,"ref_cavity_replace",pcVar18,1,uVar17);
    return 1;
  }
  uVar4 = ref_cavity_verify_face_manifold(ref_cavity);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x285,
           "ref_cavity_replace",(ulong)uVar4,"replace face manifold");
    return 1;
  }
  RVar5 = ref_cavity_verify_seg_manifold(ref_cavity);
  if (RVar5 != 0) {
    pcVar18 = "replace seg manifold";
    uVar4 = 1;
    uVar14 = 0x286;
    uVar17 = 1;
    goto LAB_0017eb5d;
  }
  uVar17 = (ulong)ref_cavity->state;
  if (uVar17 != 1) {
    pcVar18 = "attempt to replace cavity that is inconsistent";
    uVar14 = 0x289;
    goto LAB_0017ebd3;
  }
  if ((((ref_cavity->nseg == 0) && (ref_cavity->nface == 0)) && (ref_cavity->tri_list->n == 0)) &&
     (ref_cavity->tet_list->n == 0)) {
    pcVar18 = "attempt noop";
    uVar14 = 0x28e;
LAB_0017f441:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar14
           ,"ref_cavity_replace",pcVar18);
    return 1;
  }
  if (0 < ref_cavity->maxface) {
    uVar4 = ref_cavity->node;
    pRVar16 = ref_cavity->ref_grid->cell[8];
    lVar19 = 0;
    do {
      pRVar2 = ref_cavity->f2n;
      uVar7 = pRVar2[lVar19 * 3];
      if (uVar7 != 0xffffffff) {
        local_a8[0] = uVar7;
        local_a8[1] = pRVar2[lVar19 * 3 + 1];
        local_a8[2] = pRVar2[lVar19 * 3 + 2];
        local_a8[3] = uVar4;
        if (((uVar4 != uVar7) && (uVar4 != pRVar2[lVar19 * 3 + 1])) &&
           (uVar4 != pRVar2[lVar19 * 3 + 2])) {
          lVar8 = 0;
          do {
            lVar12 = (long)(int)local_a8[lVar8];
            if (((lVar12 < 0) || (ref_node->max <= (int)local_a8[lVar8])) ||
               (ref_node->global[lVar12] < 0)) {
              pcVar18 = "cavity tet nodes not valid";
              uVar14 = 0x29a;
              goto LAB_0017f441;
            }
            if (ref_node->ref_mpi->id != ref_node->part[lVar12]) {
              pcVar18 = "cavity tet nodes not local";
              uVar14 = 0x29b;
              goto LAB_0017f441;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_c0 = (REF_CELL)CONCAT44(local_c0._4_4_,uVar4);
          local_c8 = pRVar16;
          uVar4 = ref_cell_add(pRVar16,(REF_INT *)local_a8,&local_cc);
          if (uVar4 != 0) {
            pcVar18 = "add";
            uVar14 = 0x29d;
            goto LAB_0017eb5a;
          }
          uVar4 = ref_node_tet_vol(ref_node,(REF_INT *)local_a8,&local_38);
          if (uVar4 != 0) {
            pcVar18 = "norm";
            uVar14 = 0x29e;
            goto LAB_0017eb5a;
          }
          uVar4 = (uint)local_c0;
          pRVar16 = local_c8;
          if (local_38 <= ref_node->min_volume) {
            printf("%d %d %d %d %e\n",(ulong)local_a8[0],(ulong)local_a8[1],(ulong)local_a8[2],
                   (ulong)local_a8[3]);
            pRVar16 = local_c8;
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < ref_cavity->maxface);
  }
  uVar4 = ref_cavity->surf_node;
  if (uVar4 == 0xffffffff) {
    uVar4 = ref_cavity->node;
  }
  iVar6 = ref_cavity->maxseg;
  if (0 < iVar6) {
    pRVar16 = ref_cavity->ref_grid->cell[3];
    lVar19 = 0;
    do {
      pRVar2 = ref_cavity->s2n;
      uVar7 = pRVar2[lVar19 * 3];
      if (uVar7 != 0xffffffff) {
        local_a8[0] = uVar7;
        local_a8[1] = pRVar2[lVar19 * 3 + 1];
        local_a8[2] = uVar4;
        local_a8[3] = pRVar2[lVar19 * 3 + 2];
        if (uVar4 != pRVar2[lVar19 * 3 + 1] && uVar4 != uVar7) {
          lVar8 = 0;
          do {
            lVar12 = (long)(int)local_a8[lVar8];
            if (((lVar12 < 0) || (ref_node->max <= (int)local_a8[lVar8])) ||
               (ref_node->global[lVar12] < 0)) {
              pcVar18 = "cavity tri nodes not valid";
              uVar14 = 0x2ad;
              goto LAB_0017f441;
            }
            if (ref_node->ref_mpi->id != ref_node->part[lVar12]) {
              pcVar18 = "cavity tri nodes not local";
              uVar14 = 0x2ae;
              goto LAB_0017f441;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          local_c8 = (REF_CELL)CONCAT44(local_c8._4_4_,uVar4);
          local_c0 = pRVar16;
          uVar4 = ref_cell_add(pRVar16,(REF_INT *)local_a8,&local_cc);
          if (uVar4 != 0) {
            pcVar18 = "add";
            uVar14 = 0x2b0;
            goto LAB_0017eb5a;
          }
          iVar6 = ref_cavity->maxseg;
          pRVar16 = local_c0;
          uVar4 = (uint)local_c8;
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar6);
  }
  uVar4 = ref_list_create(&local_b8);
  if (uVar4 == 0) {
    pRVar13 = ref_cavity->ref_grid;
    pRVar9 = ref_cavity->tet_list;
    if (0 < pRVar9->n) {
      pRVar16 = pRVar13->cell[8];
      pRVar15 = (REF_CELL)0x0;
      local_c0 = pRVar16;
      do {
        local_cc = pRVar9->value[(long)pRVar15];
        local_c8 = pRVar15;
        uVar4 = ref_cell_nodes(pRVar16,local_cc,(REF_INT *)local_a8);
        if (uVar4 != 0) {
          pcVar18 = "rm";
          uVar14 = 0x2b9;
          goto LAB_0017eb5a;
        }
        lVar19 = 0;
        do {
          uVar4 = ref_list_push(local_b8,local_a8[lVar19]);
          pRVar16 = local_c0;
          if (uVar4 != 0) {
            pcVar18 = "tet list";
            uVar14 = 699;
            goto LAB_0017eb5a;
          }
          lVar8 = (long)(int)local_a8[lVar19];
          if (((lVar8 < 0) || (ref_node->max <= (int)local_a8[lVar19])) ||
             (ref_node->global[lVar8] < 0)) {
            pcVar18 = "cavity rm tet nodes not valid";
            uVar14 = 700;
            goto LAB_0017f441;
          }
          if (ref_node->ref_mpi->id != ref_node->part[lVar8]) {
            pcVar18 = "cavity rm tet nodes not local";
            uVar14 = 0x2bd;
            goto LAB_0017f441;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        uVar4 = ref_cell_remove(local_c0,local_cc);
        if (uVar4 != 0) {
          pcVar18 = "rm tet";
          uVar14 = 0x2bf;
          goto LAB_0017eb5a;
        }
        pRVar15 = (REF_CELL)((long)&local_c8->type + 1);
        pRVar9 = ref_cavity->tet_list;
      } while ((long)pRVar15 < (long)pRVar9->n);
      pRVar13 = ref_cavity->ref_grid;
    }
    pRVar9 = ref_cavity->tri_list;
    if (0 < pRVar9->n) {
      local_c8 = pRVar13->cell[3];
      pRVar16 = (REF_CELL)0x0;
      do {
        local_cc = pRVar9->value[(long)pRVar16];
        local_c0 = pRVar16;
        uVar4 = ref_cell_nodes(local_c8,local_cc,(REF_INT *)local_a8);
        if (uVar4 != 0) {
          pcVar18 = "rm";
          uVar14 = 0x2c5;
          goto LAB_0017eb5a;
        }
        lVar19 = 0;
        do {
          uVar4 = ref_list_push(local_b8,local_a8[lVar19]);
          if (uVar4 != 0) {
            pcVar18 = "tri list";
            uVar14 = 0x2c7;
            goto LAB_0017eb5a;
          }
          lVar8 = (long)(int)local_a8[lVar19];
          if (((lVar8 < 0) || (ref_node->max <= (int)local_a8[lVar19])) ||
             (ref_node->global[lVar8] < 0)) {
            pcVar18 = "cavity rm tri nodes not valid";
            uVar14 = 0x2c8;
            goto LAB_0017f441;
          }
          if (ref_node->ref_mpi->id != ref_node->part[lVar8]) {
            pcVar18 = "cavity rm tri nodes not local";
            uVar14 = 0x2c9;
            goto LAB_0017f441;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        uVar4 = ref_cell_remove(local_c8,local_cc);
        if (uVar4 != 0) {
          pcVar18 = "rm tri";
          uVar14 = 0x2cb;
          goto LAB_0017eb5a;
        }
        pRVar16 = (REF_CELL)((long)&local_c0->type + 1);
        pRVar9 = ref_cavity->tri_list;
      } while ((long)pRVar16 < (long)pRVar9->n);
    }
    if (0 < local_b8->n) {
      lVar19 = 0;
      do {
        iVar6 = local_b8->value[lVar19];
        pRVar16 = (REF_CELL)(long)iVar6;
        if (((-1 < (long)pRVar16) && (iVar6 < ref_node->max)) &&
           (-1 < ref_node->global[(long)pRVar16])) {
          pRVar10 = pRVar1->cell[3]->ref_adj;
          iVar11 = pRVar10->nnode;
          if ((iVar11 <= iVar6) || (pRVar10->first[(long)pRVar16] == -1)) {
            local_c8 = pRVar16;
            uVar4 = ref_geom_remove_all(ref_geom,iVar6);
            if (uVar4 != 0) {
              pcVar18 = "remove geom";
              uVar14 = 0x2d2;
              goto LAB_0017eb5a;
            }
            pRVar10 = pRVar1->cell[3]->ref_adj;
            iVar11 = pRVar10->nnode;
            pRVar16 = local_c8;
          }
          node = (REF_INT)pRVar16;
          if (((iVar11 <= node) || (pRVar10->first[(long)pRVar16] == -1)) &&
             (((pRVar10 = pRVar1->cell[8]->ref_adj, pRVar10->nnode <= node ||
               (pRVar10->first[(long)pRVar16] == -1)) &&
              (uVar4 = ref_node_remove(ref_node,node), uVar4 != 0)))) {
            pcVar18 = "remove node";
            uVar14 = 0x2d6;
            goto LAB_0017eb5a;
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < local_b8->n);
    }
    uVar4 = 0;
    if ((ref_cavity->split_node0 != 0xffffffff) && (ref_cavity->split_node1 != 0xffffffff)) {
      pRVar16 = ref_cavity->ref_grid->cell[0];
      local_a8[0] = ref_cavity->split_node0;
      local_a8[1] = ref_cavity->split_node1;
      uVar7 = ref_cell_with(pRVar16,(REF_INT *)local_a8,&local_cc);
      uVar4 = 0;
      if ((uVar7 != 0) && (uVar7 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2e0,"ref_cavity_replace",(ulong)uVar7,"find edg");
        uVar4 = uVar7;
      }
      if ((uVar7 != 5) && (uVar7 != 0)) {
        return uVar4;
      }
      if (local_cc != -1) {
        uVar7 = ref_cell_nodes(pRVar16,local_cc,(REF_INT *)local_a8);
        if (uVar7 != 0) {
          pcVar18 = "cell nodes";
          uVar14 = 0x2e2;
LAB_0017f5c8:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar14,"ref_cavity_replace",(ulong)uVar7,pcVar18);
          return uVar7;
        }
        uVar7 = ref_cell_remove(pRVar16,local_cc);
        if (uVar7 != 0) {
          pcVar18 = "remove";
          uVar14 = 0x2e3;
          goto LAB_0017f5c8;
        }
        local_a8[0] = ref_cavity->split_node0;
        local_a8[1] = ref_cavity->surf_node;
        if (local_a8[1] == 0xffffffff) {
          local_a8[1] = ref_cavity->node;
        }
        uVar7 = ref_cell_add(pRVar16,(REF_INT *)local_a8,&local_ac);
        if (uVar7 != 0) {
          pcVar18 = "add node0 version";
          uVar14 = 0x2e6;
          goto LAB_0017f5c8;
        }
        local_a8[0] = ref_cavity->surf_node;
        if (local_a8[0] == 0xffffffff) {
          local_a8[0] = ref_cavity->node;
        }
        local_a8[1] = ref_cavity->split_node1;
        uVar7 = ref_cell_add(pRVar16,(REF_INT *)local_a8,&local_ac);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x2e9,"ref_cavity_replace",(ulong)uVar7,"add node1 version");
          return uVar7;
        }
      }
    }
    if ((ref_cavity->collapse_node0 != 0xffffffff) && (ref_cavity->collapse_node1 != 0xffffffff)) {
      pRVar16 = ref_cavity->ref_grid->cell[0];
      local_a8[0] = ref_cavity->collapse_node0;
      local_a8[1] = ref_cavity->collapse_node1;
      uVar7 = ref_cell_with(pRVar16,(REF_INT *)local_a8,&local_cc);
      if ((uVar7 != 0) && (uVar7 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2f2,"ref_cavity_replace",(ulong)uVar7,"find edg");
        uVar4 = uVar7;
      }
      if ((uVar7 != 5) && (uVar7 != 0)) {
        return uVar4;
      }
      if (local_cc != -1) {
        uVar4 = ref_cell_nodes(pRVar16,local_cc,(REF_INT *)local_a8);
        if (uVar4 == 0) {
          uVar4 = ref_cell_remove(pRVar16,local_cc);
          if (uVar4 == 0) {
            uVar4 = ref_cell_replace_node
                              (pRVar16,ref_cavity->collapse_node1,ref_cavity->collapse_node0);
            if (uVar4 == 0) goto LAB_0017f7a1;
            pcVar18 = "replace node";
            uVar14 = 0x2f8;
          }
          else {
            pcVar18 = "remove";
            uVar14 = 0x2f5;
          }
        }
        else {
          pcVar18 = "cell nodes";
          uVar14 = 0x2f4;
        }
        goto LAB_0017eb5a;
      }
    }
LAB_0017f7a1:
    iVar6 = ref_cavity->node;
    if (-1 < (long)iVar6) {
      pRVar16 = ref_cavity->ref_grid->cell[8];
      pRVar10 = pRVar16->ref_adj;
      if ((iVar6 < pRVar10->nnode) && (lVar19 = (long)pRVar10->first[iVar6], lVar19 != -1)) {
        local_cc = pRVar10->item[lVar19].ref;
        uVar4 = ref_cell_nodes(pRVar16,local_cc,(REF_INT *)local_a8);
        if (uVar4 == 0) {
          do {
            lVar8 = 0;
            do {
              uVar4 = local_a8[lVar8];
              if ((((long)(int)uVar4 < 0) || (ref_node->max <= (int)uVar4)) ||
                 (ref_node->global[(int)uVar4] < 0)) {
                pcVar18 = "cavity replaced tet nodes not valid";
                uVar14 = 0x303;
                goto LAB_0017f441;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
            pRVar3 = pRVar16->ref_adj->item;
            lVar19 = (long)pRVar3[(int)lVar19].next;
            if (lVar19 == -1) goto LAB_0017f884;
            local_cc = pRVar3[lVar19].ref;
            uVar4 = ref_cell_nodes(pRVar16,local_cc,(REF_INT *)local_a8);
          } while (uVar4 == 0);
        }
        pcVar18 = "";
        uVar14 = 0x300;
        goto LAB_0017eb5a;
      }
    }
LAB_0017f884:
    local_cc = -1;
    if ((pRVar1->twod == 0) && (pRVar1->surf == 0)) {
      ppRVar20 = pRVar1->cell + 8;
    }
    else {
      ppRVar20 = pRVar1->cell + 3;
    }
    if (0 < (long)local_b8->n) {
      lVar19 = 0;
      do {
        iVar6 = local_b8->value[lVar19];
        lVar8 = (long)iVar6;
        if (((-1 < lVar8) && (iVar6 < ref_node->max)) &&
           ((-1 < ref_node->global[lVar8] &&
            (((*ppRVar20)->ref_adj->nnode <= iVar6 || ((*ppRVar20)->ref_adj->first[lVar8] == -1)))))
           ) {
          pcVar18 = "element missing for valid node";
          uVar14 = 0x30f;
          goto LAB_0017f441;
        }
        lVar19 = lVar19 + 1;
      } while (local_b8->n != lVar19);
    }
    uVar4 = ref_list_free(local_b8);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar18 = "list free";
    uVar14 = 0x313;
  }
  else {
    pcVar18 = "create removed node list";
    uVar14 = 0x2b4;
  }
LAB_0017eb5a:
  uVar17 = (ulong)uVar4;
LAB_0017eb5d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar14,
         "ref_cavity_replace",uVar17,pcVar18);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_replace(REF_CAVITY ref_cavity) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_INT face, seg;
  REF_INT cell, new_cell;
  REF_INT i, item;
  REF_DBL volume;
  REF_LIST ref_list;

  if (ref_cavity_debug(ref_cavity))
    RSS(ref_cavity_tec(ref_cavity, "ref_cavity_replace.tec"),
        "tec for replace fail");

  REIS(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
       "attempt to replace cavity that is not visible");

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "replace face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "replace seg manifold");

  REIS(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
       "attempt to replace cavity that is inconsistent");

  if (0 == ref_cavity_nseg(ref_cavity) && 0 == ref_cavity_nface(ref_cavity) &&
      0 == ref_list_n(ref_cavity_tri_list(ref_cavity)) &&
      0 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
    THROW("attempt noop");
  }
  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_face(ref_cavity, face) {
    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    nodes[3] = node;
    if (node == nodes[0] || node == nodes[1] || node == nodes[2])
      continue; /* attached face */
    for (i = 0; i < 4; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity tet nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity tet nodes not local");
    }
    RSS(ref_cell_add(ref_cell, nodes, &cell), "add");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "norm");
    if (volume <= ref_node_min_volume(ref_node))
      printf("%d %d %d %d %e\n", nodes[0], nodes[1], nodes[2], nodes[3],
             volume);
  }

  node = ref_cavity_seg_node(ref_cavity);
  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);
    if (node == nodes[0] || node == nodes[1]) continue; /* attached seg */
    for (i = 0; i < 3; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity tri nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity tri nodes not local");
    }
    RSS(ref_cell_add(ref_cell, nodes, &cell), "add");
    /* check validity, area? */
  }

  RSS(ref_list_create(&ref_list), "create removed node list");

  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "rm");
    for (i = 0; i < 4; i++) {
      RSS(ref_list_push(ref_list, nodes[i]), "tet list");
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity rm tet nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity rm tet nodes not local");
    }
    RSS(ref_cell_remove(ref_cell, cell), "rm tet");
  }

  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "rm");
    for (i = 0; i < 3; i++) {
      RSS(ref_list_push(ref_list, nodes[i]), "tri list");
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity rm tri nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity rm tri nodes not local");
    }
    RSS(ref_cell_remove(ref_cell, cell), "rm tri");
  }

  each_ref_list_item(ref_list, item) {
    node = ref_list_value(ref_list, item);
    if (ref_node_valid(ref_node, node)) {
      if (ref_cell_node_empty(ref_grid_tri(ref_grid), node)) {
        RSS(ref_geom_remove_all(ref_geom, node), "remove geom");
      }
      if (ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
          ref_cell_node_empty(ref_grid_tet(ref_grid), node)) {
        RSS(ref_node_remove(ref_node, node), "remove node");
      }
    }
  }

  if (ref_cavity->split_node0 != REF_EMPTY &&
      ref_cavity->split_node1 != REF_EMPTY) {
    nodes[0] = ref_cavity->split_node0;
    nodes[1] = ref_cavity->split_node1;
    ref_cell = ref_grid_edg(ref_cavity_grid(ref_cavity));
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find edg");
    if (REF_EMPTY != cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_cell_remove(ref_cell, cell), "remove");
      nodes[0] = ref_cavity->split_node0;
      nodes[1] = ref_cavity_seg_node(ref_cavity);
      RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
      nodes[0] = ref_cavity_seg_node(ref_cavity);
      nodes[1] = ref_cavity->split_node1;
      RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    }
  }

  if (ref_cavity->collapse_node0 != REF_EMPTY &&
      ref_cavity->collapse_node1 != REF_EMPTY) {
    nodes[0] = ref_cavity->collapse_node0;
    nodes[1] = ref_cavity->collapse_node1;
    ref_cell = ref_grid_edg(ref_cavity_grid(ref_cavity));
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find edg");
    if (REF_EMPTY != cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_cell_remove(ref_cell, cell), "remove");
      RSS(ref_cell_replace_node(ref_cell, ref_cavity->collapse_node1,
                                ref_cavity->collapse_node0),
          "replace node");
    }
  }

  /* self check to catch invalid node early */
  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "");
    for (i = 0; i < 4; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]),
          "cavity replaced tet nodes not valid");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  each_ref_list_item(ref_list, item) {
    node = ref_list_value(ref_list, item);
    if (ref_node_valid(ref_node, node)) {
      RAS(!ref_cell_node_empty(ref_cell, node),
          "element missing for valid node");
    }
  }

  RSS(ref_list_free(ref_list), "list free");

  return REF_SUCCESS;
}